

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O1

void MAFSA_str_to_int_pair(void *user_data,MAFSA_letter *l,size_t sz_l)

{
  int iVar1;
  str_inner_params *data;
  
  if (((ulong)(long)*(int *)((long)user_data + 0x14) < *(ulong *)((long)user_data + 8) >> 1) &&
     (iVar1 = MAFSA_automaton_val_to_int_pair
                        (l,sz_l,*(MAFSA_letter *)((long)user_data + 0x10),
                         (int *)((long)*(int *)((long)user_data + 0x14) * 8 + *user_data)),
     iVar1 == 0)) {
    *(int *)((long)user_data + 0x14) = *(int *)((long)user_data + 0x14) + 1;
  }
  return;
}

Assistant:

static void MAFSACALL MAFSA_str_to_int_pair(void *user_data,
    const MAFSA_letter *l, size_t sz_l)
{
    struct str_inner_params *data = (struct str_inner_params *) user_data;

    if (data->processed < data->data_sz / 2)
    {
        if (0 == MAFSA_automaton_val_to_int_pair(l, sz_l, data->delim,
                data->data + 2 * data->processed))
        {
            data->processed++;
        }
    }
}